

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackGenerator::GetComponentPackageFileName
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *initialPackageFileName,
          string *groupOrComponentName,bool isGroupName)

{
  bool bVar1;
  char *pcVar2;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  char *local_1b8;
  char *dispName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string dispVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  char *local_108;
  char *groupDispName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string groupDispVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string dispNameVar;
  string suffix;
  bool isGroupName_local;
  string *groupOrComponentName_local;
  string *initialPackageFileName_local;
  cmCPackGenerator *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dispNameVar.field_2 + 8),"-",groupOrComponentName);
  std::operator+(&local_90,"CPACK_",&this->Name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,"_USE_DISPLAY_NAME_IN_FILENAME");
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = IsOn(this,(string *)local_70);
  if (bVar1) {
    if (isGroupName) {
      cmsys::SystemTools::UpperCase((string *)&groupDispName,groupOrComponentName);
      std::operator+(&local_e0,"CPACK_COMPONENT_GROUP_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &groupDispName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     &local_e0,"_DISPLAY_NAME");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&groupDispName);
      pcVar2 = GetOption(this,(string *)local_c0);
      local_108 = pcVar2;
      if (pcVar2 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_148,pcVar2,(allocator *)(dispVar.field_2._M_local_buf + 0xf));
        std::operator+(&local_128,"-",&local_148);
        std::__cxx11::string::operator=
                  ((string *)(dispNameVar.field_2._M_local_buf + 8),(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)(dispVar.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      cmsys::SystemTools::UpperCase((string *)&dispName,groupOrComponentName);
      std::operator+(&local_190,"CPACK_COMPONENT_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dispName)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     &local_190,"_DISPLAY_NAME");
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&dispName);
      pcVar2 = GetOption(this,(string *)local_170);
      local_1b8 = pcVar2;
      if (pcVar2 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1f8,pcVar2,&local_1f9);
        std::operator+(&local_1d8,"-",&local_1f8);
        std::__cxx11::string::operator=
                  ((string *)(dispNameVar.field_2._M_local_buf + 8),(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      }
      std::__cxx11::string::~string((string *)local_170);
    }
  }
  std::operator+(__return_storage_ptr__,initialPackageFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dispNameVar.field_2 + 8));
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(dispNameVar.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentPackageFileName(
    const std::string& initialPackageFileName,
    const std::string& groupOrComponentName,
    bool isGroupName) {

  /*
   * the default behavior is to use the
   * component [group] name as a suffix
   */
  std::string suffix="-"+groupOrComponentName;
  /* check if we should use DISPLAY name */
  std::string dispNameVar = "CPACK_"+Name+"_USE_DISPLAY_NAME_IN_FILENAME";
  if (IsOn(dispNameVar))
    {
    /* the component Group case */
    if (isGroupName)
      {
      std::string groupDispVar = "CPACK_COMPONENT_GROUP_"
          + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      const char* groupDispName = GetOption(groupDispVar);
      if (groupDispName)
        {
        suffix = "-"+std::string(groupDispName);
        }
      }
    /* the [single] component case */
    else
      {
      std::string dispVar = "CPACK_COMPONENT_"
           + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
            const char* dispName = GetOption(dispVar);
            if(dispName)
              {
              suffix = "-"+std::string(dispName);
              }
            }
      }
  return initialPackageFileName + suffix;
}